

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Runner::sectionEnded(Runner *this,string *name,Counts *prevAssertions)

{
  size_t *psVar1;
  SectionInfo *pSVar2;
  IReporter *pIVar3;
  RunningTest *pRVar4;
  long lVar5;
  long local_28;
  long lStack_20;
  
  local_28 = (this->m_totals).assertions.passed - prevAssertions->passed;
  lVar5 = (this->m_totals).assertions.failed - prevAssertions->failed;
  lStack_20 = lVar5;
  if (((local_28 + lVar5 == 0) && (((this->m_config->m_data).warnings & NoAssertions) != Nothing))
     && ((pSVar2 = this->m_runningTest->m_currentSection, pSVar2 == (SectionInfo *)0x0 ||
         (pSVar2->m_status != Branch)))) {
    pIVar3 = (this->m_reporter).m_p;
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,name);
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 + 1;
    lStack_20 = lVar5 + 1;
  }
  pRVar4 = this->m_runningTest;
  pSVar2 = pRVar4->m_currentSection;
  if ((int)pSVar2->m_status < 2) {
    pSVar2->m_status = TestedLeaf;
    pRVar4->m_runStatus = RanAtLeastOneSection;
    pRVar4->m_changed = true;
  }
  else if (pRVar4->m_runStatus == EncounteredASection) {
    pRVar4->m_runStatus = RanAtLeastOneSection;
    pRVar4->m_lastSectionToRun = pSVar2;
  }
  pRVar4->m_currentSection = pSVar2->m_parent;
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,name,&local_28);
  return;
}

Assistant:

virtual void sectionEnded( const std::string& name, const Counts& prevAssertions ) {
            Counts assertions = m_totals.assertions - prevAssertions;
            if( assertions.total() == 0  &&
               ( m_config.data().warnings & ConfigData::WarnAbout::NoAssertions ) &&
               !m_runningTest->isBranchSection() ) {
                m_reporter->NoAssertionsInSection( name );
                m_totals.assertions.failed++;
                assertions.failed++;
            }
            m_runningTest->endSection( name );
            m_reporter->EndSection( name, assertions );
        }